

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slacking.hpp
# Opt level: O1

void __thiscall
slack::_detail::Slacking::Slacking(Slacking *this,string *token,bool throw_exception)

{
  pointer pcVar1;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  (this->base_url)._M_dataplus._M_p = (pointer)&(this->base_url).field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)this,"https://slack.com/api/","");
  Session::Session(&this->session_,throw_exception);
  (this->token_)._M_dataplus._M_p = (pointer)&(this->token_).field_2;
  pcVar1 = (token->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->token_,pcVar1,pcVar1 + token->_M_string_length);
  this->throw_exception_ = throw_exception;
  (this->api).slack_ = this;
  (this->conversations).slack_ = this;
  CategoryChat::CategoryChat(&this->chat,this);
  (this->users).slack_ = this;
  (this->hook).channel._M_dataplus._M_p = (pointer)&(this->hook).channel.field_2;
  (this->hook).channel._M_string_length = 0;
  (this->hook).channel.field_2._M_local_buf[0] = '\0';
  (this->hook).username._M_dataplus._M_p = (pointer)&(this->hook).username.field_2;
  (this->hook).username._M_string_length = 0;
  (this->hook).username.field_2._M_local_buf[0] = '\0';
  (this->hook).icon_emoji._M_dataplus._M_p = (pointer)&(this->hook).icon_emoji.field_2;
  (this->hook).icon_emoji._M_string_length = 0;
  (this->hook).icon_emoji.field_2._M_local_buf[0] = '\0';
  (this->hook).Id._M_dataplus._M_p = (pointer)&(this->hook).Id.field_2;
  (this->hook).Id._M_string_length = 0;
  (this->hook).Id.field_2._M_local_buf[0] = '\0';
  (this->hook).slack_ = this;
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"https://slack.com/api/","");
  std::__cxx11::string::_M_assign((string *)&(this->session_).url_);
  if (local_50[0] != local_40) {
    operator_delete(local_50[0]);
  }
  std::__cxx11::string::_M_assign((string *)&(this->session_).token_);
  return;
}

Assistant:

Slacking(const std::string& token, bool throw_exception = true) 
    : session_{throw_exception}, token_{token}, throw_exception_{throw_exception}
    {
        session_.SetUrl("https://slack.com/api/");
        session_.SetToken(token_);
    }